

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound_Queue.cpp
# Opt level: O3

ssize_t __thiscall Sound_Queue::write(Sound_Queue *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  ulong in_RAX;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  void *__src;
  
  __src = (void *)CONCAT44(in_register_00000034,__fd);
  if ((int)__buf != 0) {
    uVar4 = (ulong)__buf & 0xffffffff;
    do {
      iVar3 = (int)uVar4;
      if (2 < (ulong)(uint)this->write_buf) {
        __assert_fail("(unsigned) index < buf_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/Sound_Queue.cpp"
                      ,0x5e,"Sound_Queue::sample_t *Sound_Queue::buf(int)");
      }
      iVar2 = 0x800 - this->write_pos;
      if (iVar3 <= iVar2) {
        iVar2 = iVar3;
      }
      memcpy(this->bufs + (ulong)(uint)this->write_buf * 0x800 + (long)this->write_pos,__src,
             (long)iVar2 * 2);
      uVar1 = this->write_pos + iVar2;
      in_RAX = (ulong)uVar1;
      this->write_pos = uVar1;
      if (0x7ff < (int)uVar1) {
        this->write_pos = 0;
        this->write_buf = this->write_buf + ((this->write_buf + 1) / 3) * -3 + 1;
        in_RAX = SDL_SemWait(this->free_sem);
      }
      __src = (void *)((long)__src + (long)iVar2 * 2);
      uVar4 = (ulong)(uint)(iVar3 - iVar2);
    } while (iVar3 - iVar2 != 0);
  }
  return in_RAX;
}

Assistant:

void Sound_Queue::write( const sample_t* in, int count )
{
	while ( count )
	{
		int n = buf_size - write_pos;
		if ( n > count )
			n = count;
		
		memcpy( buf( write_buf ) + write_pos, in, n * sizeof (sample_t) );
		in += n;
		write_pos += n;
		count -= n;
		
		if ( write_pos >= buf_size )
		{
			write_pos = 0;
			write_buf = (write_buf + 1) % buf_count;
			SDL_SemWait( free_sem );
		}
	}
}